

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O3

void __thiscall CPrintVisitor::Visit(CPrintVisitor *this,CWhileStm *stm)

{
  initializer_list<INode_*> __l;
  vector<INode_*,_std::allocator<INode_*>_> children;
  allocator_type local_a9;
  vector<INode_*,_std::allocator<INode_*>_> local_a8;
  string local_90;
  vector<INode_*,_std::allocator<INode_*>_> local_70;
  ChildrenAnswers local_58;
  _Head_base<0UL,_IExpression_*,_false> local_28;
  IStatement *pIStack_20;
  
  local_28._M_head_impl =
       (stm->conditionExpression)._M_t.
       super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
       super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
       super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  pIStack_20 = (stm->statement)._M_t.
               super___uniq_ptr_impl<IStatement,_std::default_delete<IStatement>_>._M_t.
               super__Tuple_impl<0UL,_IStatement_*,_std::default_delete<IStatement>_>.
               super__Head_base<0UL,_IStatement_*,_false>._M_head_impl;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_28;
  std::vector<INode_*,_std::allocator<INode_*>_>::vector(&local_70,__l,&local_a9);
  std::vector<INode_*,_std::allocator<INode_*>_>::vector(&local_a8,&local_70);
  VisitChildren(&local_58,this,&local_a8);
  AddChildrenAnswers(this,&local_58);
  if (local_58.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58.descriptions);
  if (local_a8.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"WhileStm","");
  AddLabel(this,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  this->lastVisited = this->lastVisited + 1;
  if (local_70.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CPrintVisitor::Visit(CWhileStm &stm) {
	std::vector<INode*> children = { stm.conditionExpression.get(), stm.statement.get() };
	AddChildrenAnswers(VisitChildren(children));
	AddLabel("WhileStm");
	++lastVisited;
}